

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

char * llhttp_status_name(llhttp_status_t status)

{
  undefined4 in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  case 100:
    local_8 = "CONTINUE";
    break;
  case 0x65:
    local_8 = "SWITCHING_PROTOCOLS";
    break;
  case 0x66:
    local_8 = "PROCESSING";
    break;
  case 0x67:
    local_8 = "EARLY_HINTS";
    break;
  default:
    abort();
  case 0x6e:
    local_8 = "RESPONSE_IS_STALE";
    break;
  case 0x6f:
    local_8 = "REVALIDATION_FAILED";
    break;
  case 0x70:
    local_8 = "DISCONNECTED_OPERATION";
    break;
  case 0x71:
    local_8 = "HEURISTIC_EXPIRATION";
    break;
  case 199:
    local_8 = "MISCELLANEOUS_WARNING";
    break;
  case 200:
    local_8 = "OK";
    break;
  case 0xc9:
    local_8 = "CREATED";
    break;
  case 0xca:
    local_8 = "ACCEPTED";
    break;
  case 0xcb:
    local_8 = "NON_AUTHORITATIVE_INFORMATION";
    break;
  case 0xcc:
    local_8 = "NO_CONTENT";
    break;
  case 0xcd:
    local_8 = "RESET_CONTENT";
    break;
  case 0xce:
    local_8 = "PARTIAL_CONTENT";
    break;
  case 0xcf:
    local_8 = "MULTI_STATUS";
    break;
  case 0xd0:
    local_8 = "ALREADY_REPORTED";
    break;
  case 0xd6:
    local_8 = "TRANSFORMATION_APPLIED";
    break;
  case 0xe2:
    local_8 = "IM_USED";
    break;
  case 299:
    local_8 = "MISCELLANEOUS_PERSISTENT_WARNING";
    break;
  case 300:
    local_8 = "MULTIPLE_CHOICES";
    break;
  case 0x12d:
    local_8 = "MOVED_PERMANENTLY";
    break;
  case 0x12e:
    local_8 = "FOUND";
    break;
  case 0x12f:
    local_8 = "SEE_OTHER";
    break;
  case 0x130:
    local_8 = "NOT_MODIFIED";
    break;
  case 0x131:
    local_8 = "USE_PROXY";
    break;
  case 0x132:
    local_8 = "SWITCH_PROXY";
    break;
  case 0x133:
    local_8 = "TEMPORARY_REDIRECT";
    break;
  case 0x134:
    local_8 = "PERMANENT_REDIRECT";
    break;
  case 400:
    local_8 = "BAD_REQUEST";
    break;
  case 0x191:
    local_8 = "UNAUTHORIZED";
    break;
  case 0x192:
    local_8 = "PAYMENT_REQUIRED";
    break;
  case 0x193:
    local_8 = "FORBIDDEN";
    break;
  case 0x194:
    local_8 = "NOT_FOUND";
    break;
  case 0x195:
    local_8 = "METHOD_NOT_ALLOWED";
    break;
  case 0x196:
    local_8 = "NOT_ACCEPTABLE";
    break;
  case 0x197:
    local_8 = "PROXY_AUTHENTICATION_REQUIRED";
    break;
  case 0x198:
    local_8 = "REQUEST_TIMEOUT";
    break;
  case 0x199:
    local_8 = "CONFLICT";
    break;
  case 0x19a:
    local_8 = "GONE";
    break;
  case 0x19b:
    local_8 = "LENGTH_REQUIRED";
    break;
  case 0x19c:
    local_8 = "PRECONDITION_FAILED";
    break;
  case 0x19d:
    local_8 = "PAYLOAD_TOO_LARGE";
    break;
  case 0x19e:
    local_8 = "URI_TOO_LONG";
    break;
  case 0x19f:
    local_8 = "UNSUPPORTED_MEDIA_TYPE";
    break;
  case 0x1a0:
    local_8 = "RANGE_NOT_SATISFIABLE";
    break;
  case 0x1a1:
    local_8 = "EXPECTATION_FAILED";
    break;
  case 0x1a2:
    local_8 = "IM_A_TEAPOT";
    break;
  case 0x1a3:
    local_8 = "PAGE_EXPIRED";
    break;
  case 0x1a4:
    local_8 = "ENHANCE_YOUR_CALM";
    break;
  case 0x1a5:
    local_8 = "MISDIRECTED_REQUEST";
    break;
  case 0x1a6:
    local_8 = "UNPROCESSABLE_ENTITY";
    break;
  case 0x1a7:
    local_8 = "LOCKED";
    break;
  case 0x1a8:
    local_8 = "FAILED_DEPENDENCY";
    break;
  case 0x1a9:
    local_8 = "TOO_EARLY";
    break;
  case 0x1aa:
    local_8 = "UPGRADE_REQUIRED";
    break;
  case 0x1ac:
    local_8 = "PRECONDITION_REQUIRED";
    break;
  case 0x1ad:
    local_8 = "TOO_MANY_REQUESTS";
    break;
  case 0x1ae:
    local_8 = "REQUEST_HEADER_FIELDS_TOO_LARGE_UNOFFICIAL";
    break;
  case 0x1af:
    local_8 = "REQUEST_HEADER_FIELDS_TOO_LARGE";
    break;
  case 0x1b8:
    local_8 = "LOGIN_TIMEOUT";
    break;
  case 0x1bc:
    local_8 = "NO_RESPONSE";
    break;
  case 0x1c1:
    local_8 = "RETRY_WITH";
    break;
  case 0x1c2:
    local_8 = "BLOCKED_BY_PARENTAL_CONTROL";
    break;
  case 0x1c3:
    local_8 = "UNAVAILABLE_FOR_LEGAL_REASONS";
    break;
  case 0x1cc:
    local_8 = "CLIENT_CLOSED_LOAD_BALANCED_REQUEST";
    break;
  case 0x1cf:
    local_8 = "INVALID_X_FORWARDED_FOR";
    break;
  case 0x1ee:
    local_8 = "REQUEST_HEADER_TOO_LARGE";
    break;
  case 0x1ef:
    local_8 = "SSL_CERTIFICATE_ERROR";
    break;
  case 0x1f0:
    local_8 = "SSL_CERTIFICATE_REQUIRED";
    break;
  case 0x1f1:
    local_8 = "HTTP_REQUEST_SENT_TO_HTTPS_PORT";
    break;
  case 0x1f2:
    local_8 = "INVALID_TOKEN";
    break;
  case 499:
    local_8 = "CLIENT_CLOSED_REQUEST";
    break;
  case 500:
    local_8 = "INTERNAL_SERVER_ERROR";
    break;
  case 0x1f5:
    local_8 = "NOT_IMPLEMENTED";
    break;
  case 0x1f6:
    local_8 = "BAD_GATEWAY";
    break;
  case 0x1f7:
    local_8 = "SERVICE_UNAVAILABLE";
    break;
  case 0x1f8:
    local_8 = "GATEWAY_TIMEOUT";
    break;
  case 0x1f9:
    local_8 = "HTTP_VERSION_NOT_SUPPORTED";
    break;
  case 0x1fa:
    local_8 = "VARIANT_ALSO_NEGOTIATES";
    break;
  case 0x1fb:
    local_8 = "INSUFFICIENT_STORAGE";
    break;
  case 0x1fc:
    local_8 = "LOOP_DETECTED";
    break;
  case 0x1fd:
    local_8 = "BANDWIDTH_LIMIT_EXCEEDED";
    break;
  case 0x1fe:
    local_8 = "NOT_EXTENDED";
    break;
  case 0x1ff:
    local_8 = "NETWORK_AUTHENTICATION_REQUIRED";
    break;
  case 0x208:
    local_8 = "WEB_SERVER_UNKNOWN_ERROR";
    break;
  case 0x209:
    local_8 = "WEB_SERVER_IS_DOWN";
    break;
  case 0x20a:
    local_8 = "CONNECTION_TIMEOUT";
    break;
  case 0x20b:
    local_8 = "ORIGIN_IS_UNREACHABLE";
    break;
  case 0x20c:
    local_8 = "TIMEOUT_OCCURED";
    break;
  case 0x20d:
    local_8 = "SSL_HANDSHAKE_FAILED";
    break;
  case 0x20e:
    local_8 = "INVALID_SSL_CERTIFICATE";
    break;
  case 0x20f:
    local_8 = "RAILGUN_ERROR";
    break;
  case 0x211:
    local_8 = "SITE_IS_OVERLOADED";
    break;
  case 0x212:
    local_8 = "SITE_IS_FROZEN";
    break;
  case 0x231:
    local_8 = "IDENTITY_PROVIDER_AUTHENTICATION_ERROR";
    break;
  case 0x256:
    local_8 = "NETWORK_READ_TIMEOUT";
    break;
  case 599:
    local_8 = "NETWORK_CONNECT_TIMEOUT";
  }
  return local_8;
}

Assistant:

const char* llhttp_status_name(llhttp_status_t status) {
#define HTTP_STATUS_GEN(NUM, NAME, STRING) case HTTP_STATUS_##NAME: return #STRING;
  switch (status) {
    HTTP_STATUS_MAP(HTTP_STATUS_GEN)
    default: abort();
  }
#undef HTTP_STATUS_GEN
}